

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_target_write_size_bytes
                    (ma_dr_wav_data_format *pFormat,ma_uint64 totalFrameCount,
                    ma_dr_wav_metadata *pMetadata,ma_uint32 metadataCount)

{
  ma_dr_wav_container mVar1;
  ma_uint32 mVar2;
  ulong uVar3;
  double dVar4;
  
  dVar4 = (double)(long)((ulong)pFormat->bitsPerSample * pFormat->channels * totalFrameCount) *
          0.125;
  mVar1 = pFormat->container;
  uVar3 = (ulong)dVar4;
  uVar3 = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  if (mVar1 == ma_dr_wav_container_rf64) {
    uVar3 = ma_dr_wav__riff_chunk_size_rf64(uVar3,pMetadata,metadataCount);
  }
  else {
    if (mVar1 == ma_dr_wav_container_w64) {
      return ((uint)uVar3 & 7) + uVar3 + 0x68;
    }
    if (mVar1 != ma_dr_wav_container_riff) {
      return 0;
    }
    mVar2 = ma_dr_wav__riff_chunk_size_riff(uVar3,pMetadata,metadataCount);
    uVar3 = (ulong)mVar2;
  }
  return uVar3 + 8;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_target_write_size_bytes(const ma_dr_wav_data_format* pFormat, ma_uint64 totalFrameCount, ma_dr_wav_metadata* pMetadata, ma_uint32 metadataCount)
{
    ma_uint64 targetDataSizeBytes = (ma_uint64)((ma_int64)totalFrameCount * pFormat->channels * pFormat->bitsPerSample/8.0);
    ma_uint64 riffChunkSizeBytes;
    ma_uint64 fileSizeBytes = 0;
    if (pFormat->container == ma_dr_wav_container_riff) {
        riffChunkSizeBytes = ma_dr_wav__riff_chunk_size_riff(targetDataSizeBytes, pMetadata, metadataCount);
        fileSizeBytes = (8 + riffChunkSizeBytes);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        riffChunkSizeBytes = ma_dr_wav__riff_chunk_size_w64(targetDataSizeBytes);
        fileSizeBytes = riffChunkSizeBytes;
    } else if (pFormat->container == ma_dr_wav_container_rf64) {
        riffChunkSizeBytes = ma_dr_wav__riff_chunk_size_rf64(targetDataSizeBytes, pMetadata, metadataCount);
        fileSizeBytes = (8 + riffChunkSizeBytes);
    }
    return fileSizeBytes;
}